

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O3

void __thiscall xmrig::Api::start(Api *this)

{
  Config *pCVar1;
  Httpd *this_00;
  
  pCVar1 = Base::config(this->m_base);
  genWorkerId(this,&(pCVar1->super_BaseConfig).m_apiWorkerId);
  this_00 = (Httpd *)operator_new(0x30);
  Httpd::Httpd(this_00,this->m_base);
  this->m_httpd = this_00;
  Httpd::start(this_00);
  return;
}

Assistant:

void xmrig::Api::start()
{
    genWorkerId(m_base->config()->apiWorkerId());

#   ifdef XMRIG_FEATURE_HTTP
    m_httpd = new Httpd(m_base);
    m_httpd->start();
#   endif
}